

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall TSMuxer::processM2TSPCR(TSMuxer *this,int64_t pcrVal,int64_t pcrGAP)

{
  pointer ppVar1;
  MuxerManager *this_00;
  int iVar2;
  uint32_t uVar3;
  longlong lVar4;
  pair<unsigned_char_*,_int> *i;
  pointer ppVar5;
  int j;
  int iVar6;
  uint32_t *cur_1;
  uint32_t *cur;
  uint32_t *puVar7;
  long lVar8;
  iterator __begin2;
  pointer ppVar9;
  uint32_t *puVar10;
  double __x;
  double dVar11;
  
  ppVar1 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = 0;
  ppVar9 = (this->m_m2tsDelayBlocks).
           super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (ppVar5 = ppVar9; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    iVar2 = iVar2 + ppVar5->second;
  }
  iVar6 = this->m_prevM2TSPCROffset;
  iVar2 = (iVar2 - iVar6) + this->m_outBufLen;
  if (0x1555554 < (iVar2 * -0x55555555 + 0x2aaaaa80U >> 6 | iVar2 * -0x54000000)) {
    __assert_fail("byteCnt % 192 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                  ,0x1f1,"int TSMuxer::calcM2tsFrameCnt() const");
  }
  lVar8 = pcrVal * 300 - pcrGAP;
  dVar11 = (double)(lVar8 - this->m_prevM2TSPCR) / (double)(iVar2 / 0xc0);
  __x = (double)this->m_prevM2TSPCR;
  if (ppVar9 != ppVar1) {
    do {
      iVar2 = ppVar9->second;
      if (iVar6 < iVar2) {
        puVar7 = (uint32_t *)(ppVar9->first + iVar6);
        do {
          __x = __x + dVar11;
          lVar4 = llround(__x);
          uVar3 = my_ntohl((uint)lVar4 & 0x3fffffff);
          *puVar7 = uVar3;
          puVar7 = puVar7 + 0x30;
          iVar6 = iVar6 + 0xc0;
          iVar2 = ppVar9->second;
        } while (iVar6 < iVar2);
      }
      this_00 = (this->super_AbstractMuxer).m_owner;
      if (this_00->m_asyncMode == true) {
        MuxerManager::asyncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,ppVar9->first,iVar2,this->m_muxFile);
      }
      else {
        MuxerManager::syncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,ppVar9->first,iVar2,this->m_muxFile);
        if (ppVar9->first != (uchar *)0x0) {
          operator_delete__(ppVar9->first);
        }
      }
      iVar6 = iVar6 - ppVar9->second;
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar1);
    this->m_prevM2TSPCROffset = iVar6;
    ppVar9 = (this->m_m2tsDelayBlocks).
             super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_m2tsDelayBlocks).
        super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
      (this->m_m2tsDelayBlocks).
      super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar9;
    }
  }
  puVar7 = (uint32_t *)(this->m_outBuf + iVar6);
  puVar10 = (uint32_t *)(this->m_outBuf + this->m_outBufLen);
  if (iVar6 < this->m_outBufLen) {
    do {
      __x = __x + dVar11;
      lVar4 = llround(__x);
      uVar3 = my_ntohl((uint)lVar4 & 0x3fffffff);
      *puVar7 = uVar3;
      puVar7 = puVar7 + 0x30;
    } while (puVar7 < puVar10);
  }
  if (puVar7 == puVar10) {
    this->m_prevM2TSPCROffset = this->m_outBufLen;
    this->m_prevM2TSPCR = lVar8;
    return;
  }
  __assert_fail("curPos == end",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                ,0x21e,"void TSMuxer::processM2TSPCR(const int64_t, const int64_t)");
}

Assistant:

void TSMuxer::processM2TSPCR(const int64_t pcrVal, const int64_t pcrGAP)
{
    const int m2tsFrameCnt = calcM2tsFrameCnt();
    const int64_t hiResPCR = pcrVal * 300 - pcrGAP;
    const int64_t pcrValDif = hiResPCR - m_prevM2TSPCR;  // m2ts pcr clock based on full 27Mhz counter
    const double pcrIncPerFrame = static_cast<double>(pcrValDif) / m2tsFrameCnt;

    auto curM2TSPCR = static_cast<double>(m_prevM2TSPCR);
    uint8_t* curPos;
    if (!m_m2tsDelayBlocks.empty())
    {
        int offset = m_prevM2TSPCROffset;
        for (const auto& i : m_m2tsDelayBlocks)
        {
            curPos = i.first + offset;
            int j = offset;
            for (; j < i.second; j += 192)
            {
                curM2TSPCR += pcrIncPerFrame;
                writeM2TSHeader(curPos, llround(curM2TSPCR));
                curPos += 192;
            }
            if (m_owner->isAsyncMode())
                m_owner->asyncWriteBuffer(this, i.first, i.second, m_muxFile);
            else
            {
                m_owner->syncWriteBuffer(this, i.first, i.second, m_muxFile);
                delete[] i.first;
            }
            offset = j - i.second;
        }
        m_prevM2TSPCROffset = offset;
        m_m2tsDelayBlocks.clear();
    }
    curPos = m_outBuf + m_prevM2TSPCROffset;
    const uint8_t* end = m_outBuf + m_outBufLen;
    for (; curPos < end; curPos += 192)
    {
        curM2TSPCR += pcrIncPerFrame;
        writeM2TSHeader(curPos, llround(curM2TSPCR));
    }
    assert(curPos == end);
    m_prevM2TSPCROffset = m_outBufLen;
    // assert((int64_t) curM2TSPCR == hiResPCR);
    m_prevM2TSPCR = hiResPCR;
}